

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.cpp
# Opt level: O2

void __thiscall
ary::SceneAnchor::SceneAnchor(SceneAnchor *this,string *name,Matx44f *transform,int group)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  this->_vptr_SceneAnchor = (_func_int **)&PTR__SceneAnchor_0012e9e8;
  std::__cxx11::string::string((string *)&this->name,(string *)name);
  uVar1 = *(undefined8 *)transform->val;
  uVar2 = *(undefined8 *)(transform->val + 2);
  uVar3 = *(undefined8 *)(transform->val + 4);
  uVar4 = *(undefined8 *)(transform->val + 6);
  uVar5 = *(undefined8 *)(transform->val + 8);
  uVar6 = *(undefined8 *)(transform->val + 10);
  uVar7 = *(undefined8 *)(transform->val + 0xe);
  *(undefined8 *)((this->transform).val + 0xc) = *(undefined8 *)(transform->val + 0xc);
  *(undefined8 *)((this->transform).val + 0xe) = uVar7;
  *(undefined8 *)((this->transform).val + 8) = uVar5;
  *(undefined8 *)((this->transform).val + 10) = uVar6;
  *(undefined8 *)((this->transform).val + 4) = uVar3;
  *(undefined8 *)((this->transform).val + 6) = uVar4;
  *(undefined8 *)(this->transform).val = uVar1;
  *(undefined8 *)((this->transform).val + 2) = uVar2;
  this->group = group;
  return;
}

Assistant:

SceneAnchor::SceneAnchor(const string name, const Matx44f& transform, int group) : name(name), transform(transform), group(group) {

}